

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O0

TestCaseGroup *
vkt::SpirVAssembly::anon_unknown_5::createOpSRemComputeGroup
          (TestContext *testCtx,qpTestResult negFailResult)

{
  allocator<int> *paVar1;
  int iVar2;
  int iVar3;
  deUint32 seed;
  TestCaseGroup *pTVar4;
  TestNode *pTVar5;
  char *pcVar6;
  reference pvVar7;
  Buffer<int> *pBVar8;
  SpvAsmComputeShaderCase *this;
  pointer local_2d4;
  int local_2cc;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_2c8;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_2b8;
  SharedPtr<vkt::SpirVAssembly::BufferInterface> local_2a8;
  allocator<char> local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  allocator<char> local_269;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  int local_1e4;
  allocator<int> local_1dd;
  int ndx;
  undefined1 local_1d8 [8];
  vector<int,_std::allocator<int>_> outputInts;
  undefined1 local_1b8 [8];
  vector<int,_std::allocator<int>_> inputInts2;
  undefined1 local_198 [8];
  vector<int,_std::allocator<int>_> inputInts1;
  ComputeShaderSpec spec;
  CaseParams *params;
  int caseNdx;
  CaseParams cases [2];
  undefined1 local_48 [4];
  int numElements;
  Random rnd;
  undefined1 local_28 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  qpTestResult negFailResult_local;
  TestContext *testCtx_local;
  
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._12_4_
       = negFailResult;
  pTVar4 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup(pTVar4,testCtx,"opsrem","Test the OpSRem instruction");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&rnd.m_rnd.z + 3));
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28,pTVar4
            );
  pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                       local_28)->super_TestNode;
  pcVar6 = tcu::TestNode::getName(pTVar5);
  seed = deStringHash(pcVar6);
  de::Random::Random((Random *)local_48,seed);
  cases[0].name = "Output doesn\'t match with expected";
  cases[0].failMessage._0_4_ = 1;
  cases[0].failMessage._4_4_ = 0;
  cases[0].failResult = 0x10000;
  cases[0].op1Min = 0;
  cases[0].op1Max = 100;
  cases[0]._32_8_ = (long)"Binary doesn\'t look like SPIR-V at all" + 0x23;
  cases[1].name = "Inconsistent results, but within specification";
  cases[1].failMessage._0_4_ =
       group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
       _12_4_;
  cases[1].failMessage._4_4_ = 0xffff0000;
  cases[1].failResult = 0x10000;
  cases[1].op1Min = -100;
  cases[1].op1Max = 100;
  for (params._4_4_ = 0; params._4_4_ < 2; params._4_4_ = params._4_4_ + 1) {
    spec.verifyIO =
         (_func_bool_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>_ptr_vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>_ptr_TestLog_ptr
          *)&cases[(long)params._4_4_ + -1].op2Max;
    ComputeShaderSpec::ComputeShaderSpec
              ((ComputeShaderSpec *)
               &inputInts1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    inputInts2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    paVar1 = (allocator<int> *)
             ((long)&inputInts2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_198,200,
               (value_type_conflict1 *)
               ((long)&inputInts2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&inputInts2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    outputInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    paVar1 = (allocator<int> *)
             ((long)&outputInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 3);
    std::allocator<int>::allocator(paVar1);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1b8,200,
               (value_type_conflict1 *)
               ((long)&outputInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 4),paVar1);
    std::allocator<int>::~allocator
              ((allocator<int> *)
               ((long)&outputInts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage + 3));
    ndx = 0;
    std::allocator<int>::allocator(&local_1dd);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_1d8,200,&ndx,&local_1dd);
    std::allocator<int>::~allocator(&local_1dd);
    iVar2 = *(int *)(spec.verifyIO + 0x14);
    iVar3 = *(int *)(spec.verifyIO + 0x18);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_198,0);
    fillRandomScalars<int>((Random *)local_48,iVar2,iVar3,pvVar7,200,0);
    iVar2 = *(int *)(spec.verifyIO + 0x1c);
    iVar3 = *(int *)(spec.verifyIO + 0x20);
    pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_1b8,0);
    SpirVAssembly::(anonymous_namespace)::fillRandomScalars<int,bool(*)(long)>
              ((Random *)local_48,iVar2,iVar3,pvVar7,200,filterNotZero,0);
    for (local_1e4 = 0; local_1e4 < 200; local_1e4 = local_1e4 + 1) {
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_198,(long)local_1e4);
      iVar2 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_1b8,(long)local_1e4);
      iVar3 = *pvVar7;
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_1d8,(long)local_1e4);
      *pvVar7 = iVar2 % iVar3;
    }
    pcVar6 = getComputeAsmShaderPreamble();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,pcVar6,&local_269);
    std::operator+(&local_248,&local_268,
                   "OpName %main           \"main\"\nOpName %id             \"gl_GlobalInvocationID\"\nOpDecorate %id BuiltIn GlobalInvocationId\nOpDecorate %buf BufferBlock\nOpDecorate %indata1 DescriptorSet 0\nOpDecorate %indata1 Binding 0\nOpDecorate %indata2 DescriptorSet 0\nOpDecorate %indata2 Binding 1\nOpDecorate %outdata DescriptorSet 0\nOpDecorate %outdata Binding 2\nOpDecorate %i32arr ArrayStride 4\nOpMemberDecorate %buf 0 Offset 0\n"
                  );
    pcVar6 = getComputeAsmCommonTypes();
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_290,pcVar6,&local_291);
    std::operator+(&local_228,&local_248,&local_290);
    std::operator+(&local_208,&local_228,
                   "%buf        = OpTypeStruct %i32arr\n%bufptr     = OpTypePointer Uniform %buf\n%indata1    = OpVariable %bufptr Uniform\n%indata2    = OpVariable %bufptr Uniform\n%outdata    = OpVariable %bufptr Uniform\n%id        = OpVariable %uvec3ptr Input\n%zero      = OpConstant %i32 0\n%main      = OpFunction %void None %voidf\n%label     = OpLabel\n%idval     = OpLoad %uvec3 %id\n%x         = OpCompositeExtract %u32 %idval 0\n%inloc1    = OpAccessChain %i32ptr %indata1 %zero %x\n%inval1    = OpLoad %i32 %inloc1\n%inloc2    = OpAccessChain %i32ptr %indata2 %zero %x\n%inval2    = OpLoad %i32 %inloc2\n%rem       = OpSRem %i32 %inval1 %inval2\n%outloc    = OpAccessChain %i32ptr %outdata %zero %x\n             OpStore %outloc %rem\n             OpReturn\n             OpFunctionEnd\n"
                  );
    std::__cxx11::string::operator=
              ((string *)
               &inputInts1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(string *)&local_208);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_290);
    std::allocator<char>::~allocator(&local_291);
    std::__cxx11::string::~string((string *)&local_248);
    std::__cxx11::string::~string((string *)&local_268);
    std::allocator<char>::~allocator(&local_269);
    pBVar8 = (Buffer<int> *)operator_new(0x20);
    Buffer<int>::Buffer(pBVar8,(vector<int,_std::allocator<int>_> *)local_198);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_2a8,(BufferInterface *)pBVar8);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)((long)&spec.entryPoint.field_2 + 8),&local_2a8);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_2a8);
    pBVar8 = (Buffer<int> *)operator_new(0x20);
    Buffer<int>::Buffer(pBVar8,(vector<int,_std::allocator<int>_> *)local_1b8);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_2b8,(BufferInterface *)pBVar8);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)((long)&spec.entryPoint.field_2 + 8),&local_2b8);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_2b8);
    pBVar8 = (Buffer<int> *)operator_new(0x20);
    Buffer<int>::Buffer(pBVar8,(vector<int,_std::allocator<int>_> *)local_1d8);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::SharedPtr
              (&local_2c8,(BufferInterface *)pBVar8);
    std::
    vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ::push_back((vector<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                 *)&spec.inputs.
                    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_2c8);
    de::SharedPtr<vkt::SpirVAssembly::BufferInterface>::~SharedPtr(&local_2c8);
    tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&local_2d4,200,1,1);
    spec.numWorkGroups.m_data[0] = local_2cc;
    spec.outputs.
    super__Vector_base<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>,_std::allocator<de::SharedPtr<vkt::SpirVAssembly::BufferInterface>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2d4;
    spec.specConstants.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = *(undefined4 *)(spec.verifyIO + 0x10);
    std::__cxx11::string::operator=((string *)&spec.failResult,*(char **)(spec.verifyIO + 8));
    pTVar5 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_28)->super_TestNode;
    this = (SpvAsmComputeShaderCase *)operator_new(0x140);
    SpvAsmComputeShaderCase::SpvAsmComputeShaderCase
              (this,testCtx,*(char **)spec.verifyIO,"",
               (ComputeShaderSpec *)
               &inputInts1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,COMPUTE_TEST_USES_NONE);
    tcu::TestNode::addChild(pTVar5,(TestNode *)this);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1d8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_1b8);
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_198);
    ComputeShaderSpec::~ComputeShaderSpec
              ((ComputeShaderSpec *)
               &inputInts1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  pTVar4 = de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
           release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28)
  ;
  de::Random::~Random((Random *)local_48);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28);
  return pTVar4;
}

Assistant:

tcu::TestCaseGroup* createOpSRemComputeGroup (tcu::TestContext& testCtx, qpTestResult negFailResult)
{
	de::MovePtr<tcu::TestCaseGroup>	group			(new tcu::TestCaseGroup(testCtx, "opsrem", "Test the OpSRem instruction"));
	de::Random						rnd				(deStringHash(group->getName()));
	const int						numElements		= 200;

	const struct CaseParams
	{
		const char*		name;
		const char*		failMessage;		// customized status message
		qpTestResult	failResult;			// override status on failure
		int				op1Min, op1Max;		// operand ranges
		int				op2Min, op2Max;
	} cases[] =
	{
		{ "positive",	"Output doesn't match with expected",				QP_TEST_RESULT_FAIL,	0,		65536,	0,		100 },
		{ "all",		"Inconsistent results, but within specification",	negFailResult,			-65536,	65536,	-100,	100 },	// see below
	};
	// If either operand is negative the result is undefined. Some implementations may still return correct values.

	for (int caseNdx = 0; caseNdx < DE_LENGTH_OF_ARRAY(cases); ++caseNdx)
	{
		const CaseParams&	params		= cases[caseNdx];
		ComputeShaderSpec	spec;
		vector<deInt32>		inputInts1	(numElements, 0);
		vector<deInt32>		inputInts2	(numElements, 0);
		vector<deInt32>		outputInts	(numElements, 0);

		fillRandomScalars(rnd, params.op1Min, params.op1Max, &inputInts1[0], numElements);
		fillRandomScalars(rnd, params.op2Min, params.op2Max, &inputInts2[0], numElements, filterNotZero);

		for (int ndx = 0; ndx < numElements; ++ndx)
		{
			// The return value of std::fmod() has the same sign as its first operand, which is how OpFRem spec'd.
			outputInts[ndx] = inputInts1[ndx] % inputInts2[ndx];
		}

		spec.assembly =
			string(getComputeAsmShaderPreamble()) +

			"OpName %main           \"main\"\n"
			"OpName %id             \"gl_GlobalInvocationID\"\n"

			"OpDecorate %id BuiltIn GlobalInvocationId\n"

			"OpDecorate %buf BufferBlock\n"
			"OpDecorate %indata1 DescriptorSet 0\n"
			"OpDecorate %indata1 Binding 0\n"
			"OpDecorate %indata2 DescriptorSet 0\n"
			"OpDecorate %indata2 Binding 1\n"
			"OpDecorate %outdata DescriptorSet 0\n"
			"OpDecorate %outdata Binding 2\n"
			"OpDecorate %i32arr ArrayStride 4\n"
			"OpMemberDecorate %buf 0 Offset 0\n"

			+ string(getComputeAsmCommonTypes()) +

			"%buf        = OpTypeStruct %i32arr\n"
			"%bufptr     = OpTypePointer Uniform %buf\n"
			"%indata1    = OpVariable %bufptr Uniform\n"
			"%indata2    = OpVariable %bufptr Uniform\n"
			"%outdata    = OpVariable %bufptr Uniform\n"

			"%id        = OpVariable %uvec3ptr Input\n"
			"%zero      = OpConstant %i32 0\n"

			"%main      = OpFunction %void None %voidf\n"
			"%label     = OpLabel\n"
			"%idval     = OpLoad %uvec3 %id\n"
			"%x         = OpCompositeExtract %u32 %idval 0\n"
			"%inloc1    = OpAccessChain %i32ptr %indata1 %zero %x\n"
			"%inval1    = OpLoad %i32 %inloc1\n"
			"%inloc2    = OpAccessChain %i32ptr %indata2 %zero %x\n"
			"%inval2    = OpLoad %i32 %inloc2\n"
			"%rem       = OpSRem %i32 %inval1 %inval2\n"
			"%outloc    = OpAccessChain %i32ptr %outdata %zero %x\n"
			"             OpStore %outloc %rem\n"
			"             OpReturn\n"
			"             OpFunctionEnd\n";

		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts1)));
		spec.inputs.push_back	(BufferSp(new Int32Buffer(inputInts2)));
		spec.outputs.push_back	(BufferSp(new Int32Buffer(outputInts)));
		spec.numWorkGroups		= IVec3(numElements, 1, 1);
		spec.failResult			= params.failResult;
		spec.failMessage		= params.failMessage;

		group->addChild(new SpvAsmComputeShaderCase(testCtx, params.name, "", spec));
	}

	return group.release();
}